

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.cpp
# Opt level: O0

EscapeSequence duckdb::Terminal::ReadEscapeSequence(int ifd)

{
  int iVar1;
  idx_t length;
  char seq [5];
  char *in_stack_fffffffffffffe00;
  allocator *paVar2;
  undefined8 in_stack_fffffffffffffe08;
  allocator local_189;
  string local_188;
  allocator local_161;
  string local_160;
  allocator local_139;
  string local_138;
  allocator local_111;
  string local_110;
  allocator local_e9;
  string local_e8;
  allocator local_c1;
  string local_c0;
  allocator local_99;
  string local_98;
  allocator local_71;
  string local_70;
  allocator local_39;
  string local_38;
  idx_t local_18;
  char local_d;
  char local_c;
  char local_b;
  
  local_18 = ReadEscapeSequence((int)((ulong)in_stack_fffffffffffffe08 >> 0x20),
                                in_stack_fffffffffffffe00);
  if (local_18 == 0) {
    return INVALID;
  }
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)&local_38,"escape of length %d\n",&local_39);
  Linenoise::Log<unsigned_long>(&local_38,local_18);
  ::std::__cxx11::string::~string((string *)&local_38);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_39);
  switch(local_18) {
  case 1:
    if (('`' < local_d) && (local_d < '{')) {
      return (int)local_d - 0x54;
    }
    if (('@' < local_d) && (local_d < '[')) {
      return (int)local_d - (ALT_T|ALT_H);
    }
    if (local_d == '\x1b') {
      return ESCAPE;
    }
    if (local_d == '<') {
      return ALT_LEFT_ARROW;
    }
    if (local_d == '>') {
      return ALT_RIGHT_ARROW;
    }
    if (local_d == '\\') {
      return ALT_BACKSLASH;
    }
    if (local_d == '\x7f') {
      return ALT_BACKSPACE;
    }
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              ((string *)&local_70,"unrecognized escape sequence of length 1 - %d\n",&local_71);
    Linenoise::Log<char>(&local_70,local_d);
    ::std::__cxx11::string::~string((string *)&local_70);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_71);
    break;
  case 2:
    if (local_d == 'O') {
      switch(local_c) {
      case 'A':
        return UP;
      case 'B':
        return DOWN;
      case 'C':
        return RIGHT;
      case 'D':
        return LEFT;
      default:
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  ((string *)&local_98,"unrecognized escape sequence (O) %d\n",&local_99);
        Linenoise::Log<char>(&local_98,local_c);
        ::std::__cxx11::string::~string((string *)&local_98);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_99);
        break;
      case 'F':
        return END;
      case 'H':
        return HOME;
      case 'c':
        return ALT_F;
      case 'd':
        return ALT_B;
      }
    }
    else if (local_d == '[') {
      switch(local_c) {
      case 'A':
        return UP;
      case 'B':
        return DOWN;
      case 'C':
        return RIGHT;
      case 'D':
        return LEFT;
      default:
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  ((string *)&local_c0,"unrecognized escape sequence (seq[1]) %d\n",&local_c1);
        Linenoise::Log<char>(&local_c0,local_c);
        ::std::__cxx11::string::~string((string *)&local_c0);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_c1);
        break;
      case 'F':
        return END;
      case 'H':
        return HOME;
      case 'Z':
        return SHIFT_TAB;
      }
    }
    else {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                ((string *)&local_e8,"unrecognized escape sequence of length %d (%d %d)\n",&local_e9
                );
      Linenoise::Log<unsigned_long,char,char>(&local_e8,local_18,local_d,local_c);
      ::std::__cxx11::string::~string((string *)&local_e8);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_e9);
    }
    break;
  case 3:
    if (local_b == '~') {
      switch(local_c) {
      case '1':
        return HOME;
      default:
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  ((string *)&local_110,"unrecognized escape sequence (~) %d\n",&local_111);
        Linenoise::Log<char>(&local_110,local_c);
        ::std::__cxx11::string::~string((string *)&local_110);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_111);
        break;
      case '3':
        return DELETE;
      case '4':
      case '8':
        return END;
      }
    }
    else {
      if ((local_c == '5') && (local_b == 'C')) {
        return ALT_F;
      }
      if ((local_c == '5') && (local_b == 'D')) {
        return ALT_B;
      }
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                ((string *)&local_138,"unrecognized escape sequence of length %d\n",&local_139);
      Linenoise::Log<unsigned_long>(&local_138,local_18);
      ::std::__cxx11::string::~string((string *)&local_138);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_139);
    }
    break;
  default:
    paVar2 = &local_189;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              ((string *)&local_188,"unrecognized escape sequence of length %d\n",paVar2);
    Linenoise::Log<unsigned_long>(&local_188,local_18);
    ::std::__cxx11::string::~string((string *)&local_188);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_189);
    break;
  case 5:
    iVar1 = memcmp(&local_d,"[1;5C",5);
    if ((iVar1 == 0) || (iVar1 = memcmp(&local_d,"[1;3C",5), iVar1 == 0)) {
      return CTRL_MOVE_FORWARDS;
    }
    iVar1 = memcmp(&local_d,"[1;5D",5);
    if ((iVar1 == 0) || (iVar1 = memcmp(&local_d,"[1;3D",5), iVar1 == 0)) {
      return CTRL_MOVE_BACKWARDS;
    }
    paVar2 = &local_161;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              ((string *)&local_160,"unrecognized escape sequence (;) %d\n",paVar2);
    Linenoise::Log<char>(&local_160,local_c);
    ::std::__cxx11::string::~string((string *)&local_160);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_161);
  }
  return UNKNOWN;
}

Assistant:

EscapeSequence Terminal::ReadEscapeSequence(int ifd) {
	char seq[5];
	idx_t length = ReadEscapeSequence(ifd, seq);
	if (length == 0) {
		return EscapeSequence::INVALID;
	}
	Linenoise::Log("escape of length %d\n", length);
	switch (length) {
	case 1:
		if (seq[0] >= 'a' && seq[0] <= 'z') {
			return EscapeSequence(idx_t(EscapeSequence::ALT_A) + (seq[0] - 'a'));
		}
		if (seq[0] >= 'A' && seq[0] <= 'Z') {
			return EscapeSequence(idx_t(EscapeSequence::ALT_A) + (seq[0] - 'A'));
		}
		switch (seq[0]) {
		case BACKSPACE:
			return EscapeSequence::ALT_BACKSPACE;
		case ESC:
			return EscapeSequence::ESCAPE;
		case '<':
			return EscapeSequence::ALT_LEFT_ARROW;
		case '>':
			return EscapeSequence::ALT_RIGHT_ARROW;
		case '\\':
			return EscapeSequence::ALT_BACKSLASH;
		default:
			Linenoise::Log("unrecognized escape sequence of length 1 - %d\n", seq[0]);
			break;
		}
		break;
	case 2:
		if (seq[0] == 'O') {
			switch (seq[1]) {
			case 'A': /* Up */
				return EscapeSequence::UP;
			case 'B': /* Down */
				return EscapeSequence::DOWN;
			case 'C': /* Right */
				return EscapeSequence::RIGHT;
			case 'D': /* Left */
				return EscapeSequence::LEFT;
			case 'H': /* Home */
				return EscapeSequence::HOME;
			case 'F': /* End*/
				return EscapeSequence::END;
			case 'c':
				return EscapeSequence::ALT_F;
			case 'd':
				return EscapeSequence::ALT_B;
			default:
				Linenoise::Log("unrecognized escape sequence (O) %d\n", seq[1]);
				break;
			}
		} else if (seq[0] == '[') {
			switch (seq[1]) {
			case 'A': /* Up */
				return EscapeSequence::UP;
			case 'B': /* Down */
				return EscapeSequence::DOWN;
			case 'C': /* Right */
				return EscapeSequence::RIGHT;
			case 'D': /* Left */
				return EscapeSequence::LEFT;
			case 'H': /* Home */
				return EscapeSequence::HOME;
			case 'F': /* End*/
				return EscapeSequence::END;
			case 'Z': /* Shift Tab */
				return EscapeSequence::SHIFT_TAB;
			default:
				Linenoise::Log("unrecognized escape sequence (seq[1]) %d\n", seq[1]);
				break;
			}
		} else {
			Linenoise::Log("unrecognized escape sequence of length %d (%d %d)\n", length, seq[0], seq[1]);
		}
		break;
	case 3:
		if (seq[2] == '~') {
			switch (seq[1]) {
			case '1':
				return EscapeSequence::HOME;
			case '3': /* Delete key. */
				return EscapeSequence::DELETE;
			case '4':
			case '8':
				return EscapeSequence::END;
			default:
				Linenoise::Log("unrecognized escape sequence (~) %d\n", seq[1]);
				break;
			}
		} else if (seq[1] == '5' && seq[2] == 'C') {
			return EscapeSequence::ALT_F;
		} else if (seq[1] == '5' && seq[2] == 'D') {
			return EscapeSequence::ALT_B;
		} else {
			Linenoise::Log("unrecognized escape sequence of length %d\n", length);
		}
		break;
	case 5:
		if (memcmp(seq, "[1;5C", 5) == 0 || memcmp(seq, "[1;3C", 5) == 0) {
			// [1;5C: move word right
			return EscapeSequence::CTRL_MOVE_FORWARDS;
		} else if (memcmp(seq, "[1;5D", 5) == 0 || memcmp(seq, "[1;3D", 5) == 0) {
			// [1;5D: move word left
			return EscapeSequence::CTRL_MOVE_BACKWARDS;
		} else {
			Linenoise::Log("unrecognized escape sequence (;) %d\n", seq[1]);
		}
		break;
	default:
		Linenoise::Log("unrecognized escape sequence of length %d\n", length);
		break;
	}
	return EscapeSequence::UNKNOWN;
}